

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

FT_Error FT_Stroker_EndSubPath(FT_Stroker stroker)

{
  FT_UInt FVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FT_Pos FVar5;
  FT_Error FVar6;
  byte *pbVar7;
  FT_Angle FVar8;
  FT_Vector *pFVar9;
  FT_Int in_EDX;
  byte *extraout_RDX;
  byte *pbVar10;
  FT_Bool reverse;
  FT_Vector *pFVar11;
  FT_Vector *pFVar12;
  FT_Vector *pFVar13;
  FT_StrokeBorder border;
  FT_UInt new_points;
  
  if (stroker == (FT_Stroker)0x0) {
    return 6;
  }
  if (stroker->subpath_open == '\0') {
    if ((((stroker->center).x != (stroker->subpath_start).x) ||
        ((stroker->center).y != (stroker->subpath_start).y)) &&
       (FVar6 = FT_Stroker_LineTo(stroker,&stroker->subpath_start), FVar6 != 0)) {
      return FVar6;
    }
    stroker->angle_out = stroker->subpath_angle;
    FVar8 = FT_Angle_Diff(stroker->angle_in,stroker->subpath_angle);
    if (FVar8 != 0) {
      FVar6 = ft_stroker_inside(stroker,(uint)((ulong)FVar8 >> 0x3f),stroker->subpath_line_length);
      if (FVar6 != 0) {
        return FVar6;
      }
      FVar6 = ft_stroker_outside(stroker,(uint)(-1 < FVar8),stroker->subpath_line_length);
      if (FVar6 != 0) {
        return FVar6;
      }
    }
    ft_stroke_border_close(stroker->borders,'\0');
    border = stroker->borders + 1;
    reverse = '\x01';
  }
  else {
    FVar6 = ft_stroker_cap(stroker,stroker->angle_in,in_EDX);
    if (FVar6 != 0) {
      return FVar6;
    }
    border = stroker->borders;
    FVar1 = stroker->borders[1].num_points;
    iVar2 = stroker->borders[1].start;
    new_points = FVar1 - iVar2;
    pbVar10 = extraout_RDX;
    if (new_points != 0 && iVar2 <= (int)FVar1) {
      FVar6 = ft_stroke_border_grow(border,new_points);
      if (FVar6 != 0) {
        return FVar6;
      }
      uVar3 = stroker->borders[0].num_points;
      uVar4 = stroker->borders[1].num_points;
      pFVar9 = stroker->borders[0].points + uVar3;
      pbVar7 = stroker->borders[0].tags + uVar3;
      pFVar13 = stroker->borders[1].points;
      pbVar10 = stroker->borders[1].tags + uVar4;
      pFVar12 = pFVar13 + uVar4;
      while( true ) {
        pbVar10 = pbVar10 + -1;
        pFVar11 = pFVar12 + -1;
        FVar1 = stroker->borders[1].start;
        if (pFVar11 < pFVar13 + (int)FVar1) break;
        FVar5 = pFVar12[-1].y;
        pFVar9->x = pFVar11->x;
        pFVar9->y = FVar5;
        *pbVar7 = *pbVar10 & 0xf3;
        pFVar9 = pFVar9 + 1;
        pbVar7 = pbVar7 + 1;
        pFVar13 = stroker->borders[1].points;
        pFVar12 = pFVar11;
      }
      stroker->borders[1].num_points = FVar1;
      stroker->borders[0].num_points = stroker->borders[0].num_points + new_points;
      stroker->borders[0].movable = '\0';
      stroker->borders[1].movable = '\0';
    }
    FVar5 = (stroker->subpath_start).y;
    (stroker->center).x = (stroker->subpath_start).x;
    (stroker->center).y = FVar5;
    FVar6 = ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,(FT_Int)pbVar10);
    if (FVar6 != 0) {
      return FVar6;
    }
    reverse = '\0';
  }
  ft_stroke_border_close(border,reverse);
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_EndSubPath( FT_Stroker  stroker )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !stroker )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( stroker->subpath_open )
    {
      FT_StrokeBorder  right = stroker->borders;


      /* All right, this is an opened path, we need to add a cap between */
      /* right & left, add the reverse of left, then add a final cap     */
      /* between left & right.                                           */
      error = ft_stroker_cap( stroker, stroker->angle_in, 0 );
      if ( error )
        goto Exit;

      /* add reversed points from `left' to `right' */
      error = ft_stroker_add_reverse_left( stroker, TRUE );
      if ( error )
        goto Exit;

      /* now add the final cap */
      stroker->center = stroker->subpath_start;
      error = ft_stroker_cap( stroker,
                              stroker->subpath_angle + FT_ANGLE_PI, 0 );
      if ( error )
        goto Exit;

      /* Now end the right subpath accordingly.  The left one is */
      /* rewind and doesn't need further processing.             */
      ft_stroke_border_close( right, FALSE );
    }
    else
    {
      FT_Angle  turn;
      FT_Int    inside_side;


      /* close the path if needed */
      if ( stroker->center.x != stroker->subpath_start.x ||
           stroker->center.y != stroker->subpath_start.y )
      {
         error = FT_Stroker_LineTo( stroker, &stroker->subpath_start );
         if ( error )
           goto Exit;
      }

      /* process the corner */
      stroker->angle_out = stroker->subpath_angle;
      turn               = FT_Angle_Diff( stroker->angle_in,
                                          stroker->angle_out );

      /* no specific corner processing is required if the turn is 0 */
      if ( turn != 0 )
      {
        /* when we turn to the right, the inside side is 0 */
        /* otherwise, the inside side is 1 */
        inside_side = ( turn < 0 );

        error = ft_stroker_inside( stroker,
                                   inside_side,
                                   stroker->subpath_line_length );
        if ( error )
          goto Exit;

        /* process the outside side */
        error = ft_stroker_outside( stroker,
                                    !inside_side,
                                    stroker->subpath_line_length );
        if ( error )
          goto Exit;
      }

      /* then end our two subpaths */
      ft_stroke_border_close( stroker->borders + 0, FALSE );
      ft_stroke_border_close( stroker->borders + 1, TRUE );
    }

  Exit:
    return error;
  }